

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.h
# Opt level: O0

void __thiscall async_simple::Executor::schedule(Executor *this,Func *func,Duration dur)

{
  function<void_()> *in_stack_ffffffffffffff98;
  function<void_()> *in_stack_ffffffffffffffa0;
  type *in_stack_ffffffffffffffc8;
  thread *in_stack_ffffffffffffffd0;
  
  std::function<void_()>::function(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::thread::
  thread<async_simple::Executor::schedule(std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_,,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::thread::detach();
  std::thread::~thread((thread *)0x1ffa58);
  schedule(std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000000l>>)::{lambda()#1}
  ::~duration((type *)0x1ffa62);
  return;
}

Assistant:

virtual void schedule(Func func, Duration dur) {
        std::thread([this, func = std::move(func), dur]() {
            std::this_thread::sleep_for(dur);
            schedule(std::move(func));
        }).detach();
    }